

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O0

void __thiscall
QArrayDataPointer<QList<QBenchmarkResult>_>::reallocateAndGrow
          (QArrayDataPointer<QList<QBenchmarkResult>_> *this,GrowthPosition where,qsizetype n,
          QArrayDataPointer<QList<QBenchmarkResult>_> *old)

{
  long lVar1;
  bool bVar2;
  QList<QBenchmarkResult> *pQVar3;
  undefined8 uVar4;
  QGenericArrayOps<QList<QBenchmarkResult>_> *this_00;
  long in_RCX;
  long in_RDX;
  GrowthPosition in_ESI;
  QArrayDataPointer<QList<QBenchmarkResult>_> *in_RDI;
  long in_FS_OFFSET;
  qsizetype toCopy;
  QArrayDataPointer<QList<QBenchmarkResult>_> dp;
  QArrayDataPointer<QList<QBenchmarkResult>_> *in_stack_ffffffffffffff68;
  AllocationOption option;
  QArrayDataPointer<QList<QBenchmarkResult>_> *in_stack_ffffffffffffff70;
  QArrayDataPointer<QList<QBenchmarkResult>_> *in_stack_ffffffffffffff78;
  QGenericArrayOps<QList<QBenchmarkResult>_> *in_stack_ffffffffffffff80;
  QArrayDataPointer<QList<QBenchmarkResult>_> *n_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  n_00 = in_RDI;
  if ((((in_ESI != GrowsAtEnd) || (in_RCX != 0)) ||
      (bVar2 = needsDetach(in_stack_ffffffffffffff70), bVar2)) || (in_RDX < 1)) {
    allocateGrow((QArrayDataPointer<QList<QBenchmarkResult>_> *)&DAT_aaaaaaaaaaaaaaaa,
                 (qsizetype)n_00,in_ESI);
    if ((0 < in_RDX) &&
       (pQVar3 = data((QArrayDataPointer<QList<QBenchmarkResult>_> *)&stack0xffffffffffffffe0),
       pQVar3 == (QList<QBenchmarkResult> *)0x0)) {
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        uVar4 = qBadAlloc();
        ~QArrayDataPointer(in_stack_ffffffffffffff70);
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
          _Unwind_Resume(uVar4);
        }
      }
      goto LAB_00163e06;
    }
    if (in_RDI->size != 0) {
      bVar2 = needsDetach(in_stack_ffffffffffffff70);
      if ((bVar2) || (in_RCX != 0)) {
        this_00 = (QGenericArrayOps<QList<QBenchmarkResult>_> *)
                  operator->((QArrayDataPointer<QList<QBenchmarkResult>_> *)&stack0xffffffffffffffe0
                            );
        begin((QArrayDataPointer<QList<QBenchmarkResult>_> *)0x163d17);
        begin((QArrayDataPointer<QList<QBenchmarkResult>_> *)0x163d26);
        QtPrivate::QGenericArrayOps<QList<QBenchmarkResult>_>::copyAppend
                  (this_00,(QList<QBenchmarkResult> *)in_stack_ffffffffffffff78,
                   (QList<QBenchmarkResult> *)in_stack_ffffffffffffff70);
      }
      else {
        in_stack_ffffffffffffff70 =
             (QArrayDataPointer<QList<QBenchmarkResult>_> *)
             operator->((QArrayDataPointer<QList<QBenchmarkResult>_> *)&stack0xffffffffffffffe0);
        pQVar3 = begin((QArrayDataPointer<QList<QBenchmarkResult>_> *)0x163d5f);
        begin((QArrayDataPointer<QList<QBenchmarkResult>_> *)0x163d6e);
        QtPrivate::QGenericArrayOps<QList<QBenchmarkResult>_>::moveAppend
                  (in_stack_ffffffffffffff80,pQVar3,
                   (QList<QBenchmarkResult> *)in_stack_ffffffffffffff70);
      }
    }
    swap(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    if (in_RCX != 0) {
      swap(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    }
    ~QArrayDataPointer(in_stack_ffffffffffffff70);
  }
  else {
    operator->(in_RDI);
    option = (AllocationOption)((ulong)in_stack_ffffffffffffff68 >> 0x20);
    constAllocatedCapacity(in_stack_ffffffffffffff70);
    freeSpaceAtEnd(in_stack_ffffffffffffff78);
    QtPrivate::QMovableArrayOps<QList<QBenchmarkResult>_>::reallocate
              ((QMovableArrayOps<QList<QBenchmarkResult>_> *)in_stack_ffffffffffffff78,
               (qsizetype)in_stack_ffffffffffffff70,option);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
LAB_00163e06:
  __stack_chk_fail();
}

Assistant:

Q_NEVER_INLINE void reallocateAndGrow(QArrayData::GrowthPosition where, qsizetype n,
                                          QArrayDataPointer *old = nullptr)
    {
        if constexpr (QTypeInfo<T>::isRelocatable && alignof(T) <= alignof(std::max_align_t)) {
            if (where == QArrayData::GrowsAtEnd && !old && !needsDetach() && n > 0) {
                (*this)->reallocate(constAllocatedCapacity() - freeSpaceAtEnd() + n, QArrayData::Grow); // fast path
                return;
            }
        }

        QArrayDataPointer dp(allocateGrow(*this, n, where));
        if (n > 0)
            Q_CHECK_PTR(dp.data());
        if (where == QArrayData::GrowsAtBeginning) {
            Q_ASSERT(dp.freeSpaceAtBegin() >= n);
        } else {
            Q_ASSERT(dp.freeSpaceAtEnd() >= n);
        }
        if (size) {
            qsizetype toCopy = size;
            if (n < 0)
                toCopy += n;
            if (needsDetach() || old)
                dp->copyAppend(begin(), begin() + toCopy);
            else
                dp->moveAppend(begin(), begin() + toCopy);
            Q_ASSERT(dp.size == toCopy);
        }

        swap(dp);
        if (old)
            old->swap(dp);
    }